

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receptacle.cpp
# Opt level: O2

void __thiscall Refal2::CReceptacle::Copy(CReceptacle *this,CUnitList *key,CUnitList *value)

{
  CUnitNode *pCVar1;
  bool bVar2;
  CUnitNode *leftBorderNode;
  CUnitNode *last;
  CUnitNode *first;
  CUnitNode *local_40;
  CUnitNode *local_38;
  CUnitNode *local_30;
  CUnitNode *local_28;
  
  local_38 = (CUnitNode *)0x0;
  local_40 = (CUnitNode *)0x0;
  bVar2 = find(this,(key->super_CNodeList<Refal2::CUnit>).first,&local_38,&local_40);
  if (bVar2) {
    pCVar1 = (local_38->super_CUnit).field_1.pairedParen;
    if (local_40->next != pCVar1) {
      local_28 = (CNodeType *)0x0;
      local_30 = (CNodeType *)0x0;
      CUnitList::Duplicate(&this->data,local_40->next,pCVar1->prev,&local_28,&local_30);
      CNodeList<Refal2::CUnit>::Assign(&value->super_CNodeList<Refal2::CUnit>,local_28,local_30);
      return;
    }
  }
  CNodeList<Refal2::CUnit>::Empty(&value->super_CNodeList<Refal2::CUnit>);
  return;
}

Assistant:

void CReceptacle::Copy( const CUnitList& key, CUnitList& value )
{
	CUnitNode* leftBorderNode = nullptr;
	CUnitNode* equalNode = nullptr;
	if( find( key.GetFirst(), leftBorderNode, equalNode ) ) {
		CUnitNode* rightBorderNode = leftBorderNode->PairedParen();
		equalNode = equalNode->Next();
		if( equalNode != rightBorderNode ) {
			rightBorderNode = rightBorderNode->Prev();
			CUnitNode* first = nullptr;
			CUnitNode* last = nullptr;
			data.Duplicate( equalNode, rightBorderNode, first, last );
			value.Assign( first, last );
			return;
		}
	}
	value.Empty();
}